

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O1

void emit_GLSL_SETP(Context *ctx)

{
  uint writemask;
  uint uVar1;
  char *fmt;
  size_t in_R8;
  char *pcVar2;
  char *pcVar3;
  char src0 [64];
  char code [128];
  char src1 [64];
  char local_118 [64];
  char local_d8 [128];
  char local_58 [64];
  
  writemask = (ctx->dest_arg).writemask;
  make_GLSL_srcarg_string(ctx,0,writemask,local_118,in_R8);
  make_GLSL_srcarg_string(ctx,1,(ctx->dest_arg).writemask,local_58,in_R8);
  uVar1 = ctx->instruction_controls;
  if ((writemask >> 2 & 1) + (writemask & 1) + (uint)((writemask >> 1 & 1) != 0) +
      (uint)((writemask >> 3 & 1) != 0) == 1) {
    if (uVar1 < 7) {
      pcVar3 = *(char **)(get_METAL_comparison_string_scalar_comps + (ulong)uVar1 * 8);
    }
    else {
      failf(ctx,"%s","unknown comparison control");
      pcVar3 = "";
    }
    fmt = "(%s %s %s)";
    pcVar2 = local_118;
  }
  else {
    if (uVar1 < 7) {
      pcVar2 = get_GLSL_comparison_string_vector_comps_rel +
               *(int *)(get_GLSL_comparison_string_vector_comps_rel + (ulong)uVar1 * 4);
    }
    else {
      failf(ctx,"%s","unknown comparison control");
      pcVar2 = "";
    }
    fmt = "%s(%s, %s)";
    pcVar3 = local_118;
  }
  make_GLSL_destarg_assign(ctx,local_d8,0x80,fmt,pcVar2,pcVar3,local_58);
  output_line(ctx,"%s",local_d8);
  return;
}

Assistant:

static void emit_GLSL_SETP(Context *ctx)
{
    const int vecsize = vecsize_from_writemask(ctx->dest_arg.writemask);
    char src0[64]; make_GLSL_srcarg_string_masked(ctx, 0, src0, sizeof (src0));
    char src1[64]; make_GLSL_srcarg_string_masked(ctx, 1, src1, sizeof (src1));
    char code[128];

    // destination is always predicate register (which is type bvec4).
    if (vecsize == 1)
    {
        const char *comp = get_GLSL_comparison_string_scalar(ctx);
        make_GLSL_destarg_assign(ctx, code, sizeof (code),
                                 "(%s %s %s)", src0, comp, src1);
    } // if
    else
    {
        const char *comp = get_GLSL_comparison_string_vector(ctx);
        make_GLSL_destarg_assign(ctx, code, sizeof (code),
                                 "%s(%s, %s)", comp, src0, src1);
    } // else

    output_line(ctx, "%s", code);
}